

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

lysc_node * lyd_node_schema(lyd_node *node)

{
  lysc_node *plVar1;
  lyd_node_inner *plVar2;
  lys_module *module;
  lysc_node *parent;
  lyd_node_inner *node_00;
  lyd_node_inner *plVar3;
  ly_ht **pplVar4;
  
  if (node == (lyd_node *)0x0) {
LAB_001287dd:
    parent = (lysc_node *)0x0;
  }
  else {
    parent = node->schema;
    plVar2 = (lyd_node_inner *)node;
    if (parent == (lysc_node *)0x0) {
      do {
        plVar2 = ((lyd_node *)plVar2)->parent;
        plVar3 = (lyd_node_inner *)node;
        if (plVar2 == (lyd_node_inner *)0x0) {
          parent = (lysc_node *)0x0;
          plVar2 = (lyd_node_inner *)0x0;
          break;
        }
        parent = (plVar2->field_0).node.schema;
      } while (parent == (lysc_node *)0x0);
      do {
        while( true ) {
          node_00 = plVar3;
          if (node_00 == (lyd_node_inner *)0x0) {
            plVar3 = (lyd_node_inner *)0x0;
          }
          else {
            plVar3 = *(lyd_node_inner **)((long)&node_00->field_0 + 0x10);
          }
          if (plVar3 == plVar2) break;
          plVar3 = (lyd_node_inner *)0x0;
          if (node_00 != (lyd_node_inner *)0x0) {
            plVar3 = *(lyd_node_inner **)((long)&node_00->field_0 + 0x10);
          }
        }
        module = lyd_node_module((lyd_node *)node_00);
        if (module == (lys_module *)0x0) goto LAB_001287dd;
        plVar1 = (node_00->field_0).node.schema;
        pplVar4 = (ly_ht **)&plVar1->name;
        if (plVar1 == (lysc_node *)0x0) {
          pplVar4 = &node_00->children_ht;
        }
        parent = lys_find_child(parent,module,(char *)*pplVar4,0,0,0);
      } while ((node_00 != (lyd_node_inner *)node) &&
              (plVar3 = (lyd_node_inner *)node, plVar2 = node_00, parent != (lysc_node *)0x0));
    }
  }
  return parent;
}

Assistant:

lysc_node *
lyd_node_schema(const struct lyd_node *node)
{
    const struct lysc_node *schema = NULL;
    const struct lyd_node *prev_iter = NULL, *iter;
    const struct lys_module *mod;

    if (!node) {
        return NULL;
    } else if (node->schema) {
        return node->schema;
    }

    /* find the first schema node in the parents */
    for (iter = lyd_parent(node); iter && !iter->schema; iter = lyd_parent(iter)) {}
    if (iter) {
        prev_iter = iter;
        schema = prev_iter->schema;
    }

    /* get schema node of an opaque node */
    do {
        /* get next data node */
        for (iter = node; lyd_parent(iter) != prev_iter; iter = lyd_parent(iter)) {}

        /* get module */
        mod = lyd_node_module(iter);
        if (!mod) {
            /* unknown module, no schema node */
            schema = NULL;
            break;
        }

        /* get schema node */
        schema = lys_find_child(schema, mod, LYD_NAME(iter), 0, 0, 0);

        /* move to the descendant */
        prev_iter = iter;
    } while (schema && (iter != node));

    return schema;
}